

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_use_port(Curl_easy *data,ftpport fcmd)

{
  char cVar1;
  unsigned_short uVar2;
  int iVar3;
  CURLcode CVar4;
  uint uVar5;
  if2ip_result_t iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  undefined6 extraout_var;
  long lVar12;
  char cVar13;
  connectdata *pcVar14;
  size_t sVar15;
  ftpport fVar16;
  ushort uVar17;
  uint uVar18;
  char *pcVar19;
  Curl_addrinfo *ai;
  ushort uVar20;
  int iVar21;
  curl_socket_t portsock;
  curl_socklen_t sslen;
  connectdata *local_660;
  ftpport local_654;
  uint local_650;
  undefined4 local_64c;
  pingpong *local_648;
  Curl_dns_entry *h;
  char myhost [47];
  Curl_sockaddr_storage ss;
  char target [67];
  char buffer [256];
  char hbuf [1025];
  
  pcVar14 = data->conn;
  portsock = -1;
  myhost[0x20] = '\0';
  myhost[0x21] = '\0';
  myhost[0x22] = '\0';
  myhost[0x23] = '\0';
  myhost[0x24] = '\0';
  myhost[0x25] = '\0';
  myhost[0x26] = '\0';
  myhost[0x27] = '\0';
  myhost[0x28] = '\0';
  myhost[0x29] = '\0';
  myhost[0x2a] = '\0';
  myhost[0x2b] = '\0';
  myhost[0x2c] = '\0';
  myhost[0x2d] = '\0';
  myhost[0x2e] = '\0';
  myhost[0x10] = '\0';
  myhost[0x11] = '\0';
  myhost[0x12] = '\0';
  myhost[0x13] = '\0';
  myhost[0x14] = '\0';
  myhost[0x15] = '\0';
  myhost[0x16] = '\0';
  myhost[0x17] = '\0';
  myhost[0x18] = '\0';
  myhost[0x19] = '\0';
  myhost[0x1a] = '\0';
  myhost[0x1b] = '\0';
  myhost[0x1c] = '\0';
  myhost[0x1d] = '\0';
  myhost[0x1e] = '\0';
  myhost[0x1f] = '\0';
  myhost[0] = '\0';
  myhost[1] = '\0';
  myhost[2] = '\0';
  myhost[3] = '\0';
  myhost[4] = '\0';
  myhost[5] = '\0';
  myhost[6] = '\0';
  myhost[7] = '\0';
  myhost[8] = '\0';
  myhost[9] = '\0';
  myhost[10] = '\0';
  myhost[0xb] = '\0';
  myhost[0xc] = '\0';
  myhost[0xd] = '\0';
  myhost[0xe] = '\0';
  myhost[0xf] = '\0';
  pcVar19 = (data->set).str[0xc];
  h = (Curl_dns_entry *)0x0;
  local_654 = fcmd;
  if ((pcVar19 == (char *)0x0) || (sVar7 = strlen(pcVar19), sVar7 < 2)) {
    pcVar8 = (char *)0x0;
    uVar17 = 0;
    uVar5 = 0;
LAB_004b4ac6:
    sslen = 0x80;
    iVar3 = getsockname(pcVar14->sock[0],(sockaddr *)&ss,&sslen);
    if (iVar3 != 0) {
      piVar10 = __errno_location();
      pcVar19 = Curl_strerror(*piVar10,buffer,0x100);
      pcVar9 = "getsockname() failed: %s";
      goto LAB_004b4bdc;
    }
    pcVar19 = inet_ntop((uint)ss.buffer.sa.sa_family,
                        target + (ulong)(ss.buffer.sa.sa_family == 10) * 4 + -0x7c,hbuf,0x401);
    if (pcVar19 == (char *)0x0) {
      return CURLE_FTP_PORT_FAILED;
    }
    local_64c = 0;
    pcVar19 = hbuf;
    local_650 = uVar5;
  }
  else {
    sVar15 = 0x2f;
    if (0x2d < sVar7) {
      sVar15 = sVar7 + 1;
    }
    pcVar8 = (char *)(*Curl_ccalloc)(sVar15,1);
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar9 = pcVar19;
    if (*pcVar19 == ':') {
LAB_004b4c62:
      pcVar19 = strchr(pcVar9,0x3a);
      if (pcVar19 == (char *)0x0) {
        uVar5 = 0;
        uVar17 = 0;
      }
      else {
        uVar11 = strtoul(pcVar19 + 1,(char **)0x0,10);
        uVar2 = curlx_ultous(uVar11);
        pcVar19 = strchr(pcVar19,0x2d);
        uVar5 = (uint)CONCAT62(extraout_var,uVar2);
        uVar18 = uVar5;
        if (pcVar19 != (char *)0x0) {
          uVar11 = strtoul(pcVar19 + 1,(char **)0x0,10);
          uVar2 = curlx_ultous(uVar11);
          uVar18 = (uint)uVar2;
        }
        uVar17 = (ushort)uVar18;
      }
    }
    else {
      if (*pcVar19 == '[') {
        pcVar9 = strchr(pcVar19,0x5d);
        if (pcVar9 != (char *)0x0) {
          pcVar19 = pcVar19 + 1;
LAB_004b4c4b:
          strncpy(pcVar8,pcVar19,(long)pcVar9 - (long)pcVar19);
          goto LAB_004b4c62;
        }
      }
      else {
        pcVar9 = strchr(pcVar19,0x3a);
        if ((pcVar9 != (char *)0x0) && (iVar3 = inet_pton(10,pcVar19,&ss), iVar3 != 1))
        goto LAB_004b4c4b;
        strcpy(pcVar8,pcVar19);
      }
      uVar5 = 0;
      uVar17 = 0;
    }
    if (uVar17 < (ushort)uVar5) {
      uVar5 = 0;
      uVar17 = 0;
    }
    if (*pcVar8 == '\0') goto LAB_004b4ac6;
    iVar3 = pcVar14->ip_addr->ai_family;
    local_650 = uVar5;
    uVar5 = Curl_ipv6_scope(pcVar14->ip_addr->ai_addr);
    pcVar19 = pcVar8;
    iVar6 = Curl_if2ip(iVar3,uVar5,pcVar14->scope_id,pcVar8,hbuf,0x401);
    local_64c = (undefined4)CONCAT71((int7)((ulong)pcVar19 >> 8),1);
    pcVar19 = pcVar8;
    if (iVar6 != IF2IP_NOT_FOUND) {
      if (iVar6 == IF2IP_AF_NOT_SUPPORTED) {
        return CURLE_FTP_PORT_FAILED;
      }
      pcVar19 = hbuf;
      uVar5 = local_650;
      if (iVar6 != IF2IP_FOUND) goto LAB_004b4ac6;
    }
  }
  Curl_resolv(data,pcVar19,0,false,&h);
  if (h != (Curl_dns_entry *)0x0) {
    ai = h->addr;
    Curl_resolv_unlock(data,h);
    if (ai != (Curl_addrinfo *)0x0) {
      local_648 = (pingpong *)&pcVar14->proto;
      (*Curl_cfree)(pcVar8);
      portsock = -1;
      iVar3 = 0;
      while( true ) {
        if (ai == (Curl_addrinfo *)0x0) {
          pcVar19 = Curl_strerror(iVar3,buffer,0x100);
          Curl_failf(data,"socket failure: %s",pcVar19);
          return CURLE_FTP_PORT_FAILED;
        }
        CVar4 = Curl_socket(data,ai,(Curl_sockaddr_ex *)0x0,&portsock);
        if (CVar4 == CURLE_OK) break;
        piVar10 = __errno_location();
        iVar3 = *piVar10;
        ai = ai->ai_next;
      }
      memcpy(&ss,ai->ai_addr,(ulong)ai->ai_addrlen);
      sslen = ai->ai_addrlen;
      uVar5 = local_650;
      local_660 = pcVar14;
      while( true ) {
        uVar20 = (ushort)uVar5;
        if (uVar17 < uVar20) {
          Curl_failf(data,"bind() failed, we ran out of ports");
          pcVar14 = local_660;
          goto LAB_004b4f29;
        }
        ss.buffer.sa_in.sin_port = uVar20 << 8 | uVar20 >> 8;
        iVar3 = bind(portsock,(sockaddr *)&ss,sslen);
        if (iVar3 == 0) break;
        piVar10 = __errno_location();
        iVar3 = *piVar10;
        if ((iVar3 == 99 & (byte)local_64c) == 1) {
          pcVar19 = Curl_strerror(99,buffer,0x100);
          local_64c = 0;
          Curl_infof(data,"bind(port=%hu) on non-local address failed: %s",(ulong)(uVar5 & 0xffff),
                     pcVar19);
          pcVar14 = local_660;
          sslen = 0x80;
          iVar3 = getsockname(local_660->sock[0],(sockaddr *)&ss,&sslen);
          uVar5 = local_650;
          if (iVar3 != 0) {
            pcVar19 = Curl_strerror(*piVar10,buffer,0x100);
            Curl_failf(data,"getsockname() failed: %s",pcVar19);
LAB_004b4f29:
            Curl_closesocket(data,pcVar14,portsock);
            return CURLE_FTP_PORT_FAILED;
          }
        }
        else {
          if ((iVar3 != 0xd) && (iVar3 != 0x62)) {
            pcVar19 = Curl_strerror(iVar3,buffer,0x100);
            Curl_failf(data,"bind(port=%hu) failed: %s",(ulong)(uVar5 & 0xffff),pcVar19);
            pcVar14 = local_660;
            goto LAB_004b4f29;
          }
          uVar5 = uVar5 + 1;
        }
      }
      sslen = 0x80;
      iVar3 = getsockname(portsock,(sockaddr *)&ss,&sslen);
      if (iVar3 == 0) {
        iVar21 = 1;
        iVar3 = listen(portsock,1);
        if (iVar3 == 0) {
          Curl_printable_address(ai,myhost,0x2f);
          uVar5 = *(uint *)&(local_660->bits).field_0x4;
          if ((uVar5 & 0x81000) == 0x1000) {
            uVar5 = uVar5 | 0x80000;
            *(uint *)&(local_660->bits).field_0x4 = uVar5;
          }
          fVar16 = local_654;
          do {
            if (fVar16 == DONE) {
              iVar21 = 2;
LAB_004b5023:
              pcVar14 = local_660;
              (local_660->proto).ftpc.count1 = iVar21;
              close_secondarysocket(data,local_660);
              pcVar14->sock[1] = portsock;
              (pcVar14->bits).tcpconnect[1] = true;
              (data->conn->proto).ftpc.state = FTP_PORT;
              return CURLE_OK;
            }
            if ((((uVar5 & 0x80000) != 0 || fVar16 != EPRT) &&
                (fVar16 != PORT || ss.buffer.sa.sa_family == 2)) &&
               ((ss.buffer.sa.sa_family | 8) == 10)) {
              if (fVar16 == EPRT) {
                iVar21 = 0;
                CVar4 = Curl_pp_sendf(data,local_648,"%s |%d|%s|%hu|",ftp_state_use_port::mode,
                                      (ulong)((ss.buffer.sa.sa_family != 2) + 1),myhost,
                                      (uint)(ushort)(ss.buffer.sa_in.sin_port << 8 |
                                                    ss.buffer.sa_in.sin_port >> 8));
                if (CVar4 == CURLE_OK) goto LAB_004b5023;
                pcVar19 = curl_easy_strerror(CVar4);
                Curl_failf(data,"Failure sending EPRT command: %s",pcVar19);
                pcVar14 = local_660;
                Curl_closesocket(data,local_660,portsock);
                (pcVar14->proto).ftpc.count1 = 1;
                goto LAB_004b5185;
              }
              if (fVar16 == PORT) {
                lVar12 = 0;
                while( true ) {
                  cVar1 = myhost[lVar12];
                  cVar13 = ',';
                  if ((cVar1 != '.') && (cVar13 = cVar1, cVar1 == '\0')) break;
                  target[lVar12] = cVar13;
                  lVar12 = lVar12 + 1;
                }
                target[lVar12] = '\0';
                curl_msnprintf(target + lVar12,0x14,",%d,%d",
                               (ulong)(ss.buffer.sa_in.sin_port & 0xff),
                               (ulong)(byte)((ushort)ss.buffer._2_2_ >> 8));
                CVar4 = Curl_pp_sendf(data,local_648,"%s %s",0x668561,target);
                if (CVar4 == CURLE_OK) goto LAB_004b5023;
                pcVar19 = curl_easy_strerror(CVar4);
                Curl_failf(data,"Failure sending PORT command: %s",pcVar19);
                Curl_closesocket(data,local_660,portsock);
LAB_004b5185:
                (data->conn->proto).ftpc.state = FTP_STOP;
                return CVar4;
              }
            }
            fVar16 = fVar16 + PORT;
          } while( true );
        }
        piVar10 = __errno_location();
        pcVar19 = Curl_strerror(*piVar10,buffer,0x100);
        pcVar8 = "socket failure: %s";
      }
      else {
        piVar10 = __errno_location();
        pcVar19 = Curl_strerror(*piVar10,buffer,0x100);
        pcVar8 = "getsockname() failed: %s";
      }
      Curl_failf(data,pcVar8,pcVar19);
      Curl_closesocket(data,local_660,portsock);
      return CURLE_FTP_PORT_FAILED;
    }
  }
  pcVar9 = "failed to resolve the address provided to PORT: %s";
LAB_004b4bdc:
  Curl_failf(data,pcVar9,pcVar19);
  (*Curl_cfree)(pcVar8);
  return CURLE_FTP_PORT_FAILED;
}

Assistant:

static CURLcode ftp_state_use_port(struct Curl_easy *data,
                                   ftpport fcmd) /* start with this */
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  curl_socket_t portsock = CURL_SOCKET_BAD;
  char myhost[MAX_IPADR_LEN + 1] = "";

  struct Curl_sockaddr_storage ss;
  struct Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa = (struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  static const char mode[][5] = { "EPRT", "PORT" };
  enum resolve_t rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h = NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;
  char buffer[STRERROR_LEN];
  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen + 1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      ip_end = strchr(string_ftpport, ']');
      if(ip_end)
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
      }
      else {
        ip_end = strchr(string_ftpport, ':');
        if(ip_end) {
          /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
          if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
            /* ipv6 */
            port_min = port_max = 0;
            strcpy(addr, string_ftpport);
            ip_end = NULL; /* this got no port ! */
          }
          else
#endif
            /* (ipv4|domain|interface):port(-range) */
            strncpy(addr, string_ftpport, ip_end - ip_start);
        }
        else
          /* ipv4|interface */
          strcpy(addr, string_ftpport);
      }

    /* parse the port */
    if(ip_end) {
      port_start = strchr(ip_end, ':');
      if(port_start) {
        port_min = curlx_ultous(strtoul(port_start + 1, NULL, 10));
        port_sep = strchr(port_start, '-');
        if(port_sep) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711,  in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max)
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->ip_addr->ai_family,
#ifdef ENABLE_IPV6
                        Curl_ipv6_scope(conn->ip_addr->ai_addr),
                        conn->scope_id,
#endif
                        addr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as host name instead */
          host = addr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          return CURLE_FTP_PORT_FAILED;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for host name */
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    const char *r;
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */
    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      free(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      r = Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      r = Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    if(!r)
      return CURLE_FTP_PORT_FAILED;
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(data, host, 0, FALSE, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(data, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(!res) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    free(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  free(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(data, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s",
          Curl_strerror(error, buffer, sizeof(buffer)));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */
        infof(data, "bind(port=%hu) on non-local address failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
          Curl_closesocket(data, conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));
        Curl_closesocket(data, conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports");
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(data, conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(data, FTP_STOP);
        return result;
      }
      break;
    }
    if(PORT == fcmd) {
      /* large enough for [IP address],[num],[num] */
      char target[sizeof(myhost) + 20];
      char *source = myhost;
      char *dest = target;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest = ',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      msnprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(data, &ftpc->pp, "%s %s", mode[fcmd], target);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(data, conn, portsock);
        /* bail out */
        state(data, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  close_secondarysocket(data, conn);

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(data, FTP_PORT);
  return result;
}